

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

bool __thiscall
ExecutorRegVm::RunExternalFunction(ExecutorRegVm *this,uint funcID,uint *callStorage)

{
  Stop(this,"ERROR: external raw function calls are disabled");
  return false;
}

Assistant:

bool ExecutorRegVm::RunExternalFunction(unsigned funcID, unsigned *callStorage)
{
#if !defined(NULLC_NO_RAW_EXTERNAL_CALL)
	RunRawExternalFunction(dcCallVM, exFunctions[funcID], exLinker->exLocals.data, exTypes.data, exLinker->exTypeExtra.data, callStorage, callStorage);

	return callContinue;
#else
	(void)funcID;
	(void)callStorage;

	Stop("ERROR: external raw function calls are disabled");

	return false;
#endif
}